

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkRenderPassInputAttachmentAspectCreateInfo *create_info,
          ScratchAllocator *alloc)

{
  VkRenderPassInputAttachmentAspectCreateInfo *pVVar1;
  VkInputAttachmentAspectReference *pVVar2;
  VkRenderPassInputAttachmentAspectCreateInfo *input_att;
  ScratchAllocator *alloc_local;
  VkRenderPassInputAttachmentAspectCreateInfo *create_info_local;
  Impl *this_local;
  
  pVVar1 = copy<VkRenderPassInputAttachmentAspectCreateInfo>(this,create_info,1,alloc);
  pVVar2 = copy<VkInputAttachmentAspectReference>
                     (this,pVVar1->pAspectReferences,(ulong)pVVar1->aspectReferenceCount,alloc);
  pVVar1->pAspectReferences = pVVar2;
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkRenderPassInputAttachmentAspectCreateInfo *create_info,
                                             ScratchAllocator &alloc)
{
	auto *input_att = copy(create_info, 1, alloc);
	input_att->pAspectReferences = copy(input_att->pAspectReferences, input_att->aspectReferenceCount, alloc);
	return input_att;
}